

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O0

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  auto_ptr_ref<cmFunctionBlocker> r;
  cmFunctionBlocker *pcVar4;
  size_type sVar5;
  reference pvVar6;
  cmake *pcVar7;
  cmListFileContext *pcVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 local_268 [8];
  cmListFileBacktrace bt_2;
  string err;
  undefined1 local_220 [7];
  bool isTrue;
  undefined1 local_200 [8];
  cmConditionEvaluator conditionEvaluator;
  cmListFileContext conditionContext;
  undefined1 local_130 [4];
  MessageType messType;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  string local_f0;
  undefined1 local_d0 [8];
  cmListFileBacktrace bt_1;
  string local_a8;
  undefined1 local_88 [8];
  cmListFileBacktrace bt;
  int local_60;
  uint c;
  int scopeDepth;
  cmExecutionStatus local_50;
  uint local_4c;
  cmExecutionStatus status;
  auto_ptr<cmFunctionBlocker> local_38;
  auto_ptr<cmFunctionBlocker> fb;
  cmExecutionStatus *inStatus_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmIfFunctionBlocker *this_local;
  
  fb.x_ = (cmFunctionBlocker *)inStatus;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"if");
  if (iVar2 == 0) {
    this->ScopeDepth = this->ScopeDepth + 1;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"endif");
    if ((iVar2 == 0) && (this->ScopeDepth = this->ScopeDepth - 1, this->ScopeDepth == 0)) {
      cmMakefile::RemoveFunctionBlocker
                ((cmMakefile *)&status,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
      r = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&status);
      ::cm::auto_ptr<cmFunctionBlocker>::auto_ptr(&local_38,r);
      ::cm::auto_ptr<cmFunctionBlocker>::~auto_ptr((auto_ptr<cmFunctionBlocker> *)&status);
      pcVar4 = ::cm::auto_ptr<cmFunctionBlocker>::get(&local_38);
      if (pcVar4 == (cmFunctionBlocker *)0x0) {
        this_local._7_1_ = 0;
        local_4c = 1;
      }
      else {
        cmExecutionStatus::cmExecutionStatus(&local_50);
        local_60 = 0;
        for (bt.Cur._4_4_ = 0; uVar9 = (ulong)bt.Cur._4_4_,
            sVar5 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                              (&this->Functions), uVar9 < sVar5; bt.Cur._4_4_ = bt.Cur._4_4_ + 1) {
          std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                    (&this->Functions,(ulong)bt.Cur._4_4_);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"if");
          if (iVar2 == 0) {
            local_60 = local_60 + 1;
          }
          std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                    (&this->Functions,(ulong)bt.Cur._4_4_);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"endif");
          if (iVar2 == 0) {
            local_60 = local_60 + -1;
          }
          if (local_60 == 0) {
            std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                      (&this->Functions,(ulong)bt.Cur._4_4_);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"else");
            if (iVar2 != 0) goto LAB_007abda7;
            if ((this->ElseSeen & 1U) != 0) {
              pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                       operator[](&this->Functions,(ulong)bt.Cur._4_4_);
              cmMakefile::GetBacktrace
                        ((cmListFileBacktrace *)local_88,mf,&pvVar6->super_cmCommandContext);
              pcVar7 = cmMakefile::GetCMakeInstance(mf);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_a8,
                         "A duplicate ELSE command was found inside an IF block.",
                         (allocator *)((long)&bt_1.Cur + 7));
              cmake::IssueMessage(pcVar7,FATAL_ERROR,&local_a8,(cmListFileBacktrace *)local_88);
              std::__cxx11::string::~string((string *)&local_a8);
              std::allocator<char>::~allocator((allocator<char> *)((long)&bt_1.Cur + 7));
              cmSystemTools::SetFatalErrorOccured();
              this_local._7_1_ = 1;
              local_4c = 1;
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_88);
              goto LAB_007ac434;
            }
            this->IsBlocking = (bool)(this->HasRun & 1);
            this->HasRun = true;
            this->ElseSeen = true;
            if ((this->IsBlocking & 1U) == 0) {
              pcVar7 = cmMakefile::GetCMakeInstance(mf);
              bVar1 = cmake::GetTrace(pcVar7);
              if (bVar1) {
                pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                         operator[](&this->Functions,(ulong)bt.Cur._4_4_);
                cmMakefile::PrintCommandTrace(mf,pvVar6);
              }
            }
          }
          else {
LAB_007abda7:
            if (local_60 == 0) {
              std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                        (&this->Functions,(ulong)bt.Cur._4_4_);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"elseif");
              if (iVar2 == 0) {
                if ((this->ElseSeen & 1U) == 0) {
                  if ((this->HasRun & 1U) != 0) {
                    this->IsBlocking = true;
                    goto LAB_007ac419;
                  }
                  pcVar7 = cmMakefile::GetCMakeInstance(mf);
                  bVar1 = cmake::GetTrace(pcVar7);
                  if (bVar1) {
                    pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                             operator[](&this->Functions,(ulong)bt.Cur._4_4_);
                    cmMakefile::PrintCommandTrace(mf,pvVar6);
                  }
                  std::__cxx11::string::string
                            ((string *)
                             &expandedArguments.
                              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ::vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            *)local_130);
                  pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                           operator[](&this->Functions,(ulong)bt.Cur._4_4_);
                  cmMakefile::ExpandArguments
                            (mf,&pvVar6->Arguments,
                             (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                              *)local_130,(char *)0x0);
                  pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                           operator[](&this->Functions,(ulong)bt.Cur._4_4_);
                  pcVar8 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
                  cmListFileContext::FromCommandContext
                            ((cmListFileContext *)&conditionEvaluator.Policy57Status,
                             &pvVar6->super_cmCommandContext,&pcVar8->FilePath);
                  pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                           operator[](&this->Functions,(ulong)bt.Cur._4_4_);
                  cmMakefile::GetBacktrace
                            ((cmListFileBacktrace *)local_220,mf,&pvVar6->super_cmCommandContext);
                  cmConditionEvaluator::cmConditionEvaluator
                            ((cmConditionEvaluator *)local_200,mf,
                             (cmListFileContext *)&conditionEvaluator.Policy57Status,
                             (cmListFileBacktrace *)local_220);
                  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_220);
                  bVar1 = cmConditionEvaluator::IsTrue
                                    ((cmConditionEvaluator *)local_200,
                                     (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                      *)local_130,
                                     (string *)
                                     &expandedArguments.
                                      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (MessageType *)((long)&conditionContext.Line + 4));
                  uVar9 = std::__cxx11::string::empty();
                  if ((uVar9 & 1) == 0) {
                    cmIfCommandError_abi_cxx11_
                              ((string *)&bt_2.Cur,
                               (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                *)local_130);
                    std::__cxx11::string::operator+=
                              ((string *)&bt_2.Cur,
                               (string *)
                               &expandedArguments.
                                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                             operator[](&this->Functions,(ulong)bt.Cur._4_4_);
                    cmMakefile::GetBacktrace
                              ((cmListFileBacktrace *)local_268,mf,&pvVar6->super_cmCommandContext);
                    pcVar7 = cmMakefile::GetCMakeInstance(mf);
                    cmake::IssueMessage(pcVar7,conditionContext.Line._4_4_,(string *)&bt_2.Cur,
                                        (cmListFileBacktrace *)local_268);
                    bVar10 = conditionContext.Line._4_4_ == FATAL_ERROR;
                    if (bVar10) {
                      cmSystemTools::SetFatalErrorOccured();
                      this_local._7_1_ = 1;
                    }
                    local_4c = (uint)bVar10;
                    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_268);
                    std::__cxx11::string::~string((string *)&bt_2.Cur);
                    if (local_4c == 0) goto LAB_007ac27f;
                  }
                  else {
LAB_007ac27f:
                    if (bVar1) {
                      this->IsBlocking = false;
                      this->HasRun = true;
                    }
                    local_4c = 0;
                  }
                  cmConditionEvaluator::~cmConditionEvaluator((cmConditionEvaluator *)local_200);
                  cmListFileContext::~cmListFileContext
                            ((cmListFileContext *)&conditionEvaluator.Policy57Status);
                  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ::~vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             *)local_130);
                  std::__cxx11::string::~string
                            ((string *)
                             &expandedArguments.
                              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (local_4c == 0) goto LAB_007ac419;
                }
                else {
                  pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                           operator[](&this->Functions,(ulong)bt.Cur._4_4_);
                  cmMakefile::GetBacktrace
                            ((cmListFileBacktrace *)local_d0,mf,&pvVar6->super_cmCommandContext);
                  pcVar7 = cmMakefile::GetCMakeInstance(mf);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_f0,
                             "An ELSEIF command was found after an ELSE command.",
                             (allocator *)(errorString.field_2._M_local_buf + 0xf));
                  cmake::IssueMessage(pcVar7,FATAL_ERROR,&local_f0,(cmListFileBacktrace *)local_d0);
                  std::__cxx11::string::~string((string *)&local_f0);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)(errorString.field_2._M_local_buf + 0xf));
                  cmSystemTools::SetFatalErrorOccured();
                  this_local._7_1_ = 1;
                  local_4c = 1;
                  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_d0);
                }
                goto LAB_007ac434;
              }
            }
            if ((this->IsBlocking & 1U) == 0) {
              cmExecutionStatus::Clear(&local_50);
              pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                       operator[](&this->Functions,(ulong)bt.Cur._4_4_);
              cmMakefile::ExecuteCommand(mf,pvVar6,&local_50);
              bVar1 = cmExecutionStatus::GetReturnInvoked(&local_50);
              if (bVar1) {
                cmExecutionStatus::SetReturnInvoked((cmExecutionStatus *)fb.x_);
                this_local._7_1_ = 1;
                local_4c = 1;
                goto LAB_007ac434;
              }
              bVar1 = cmExecutionStatus::GetBreakInvoked(&local_50);
              if (bVar1) {
                cmExecutionStatus::SetBreakInvoked((cmExecutionStatus *)fb.x_);
                this_local._7_1_ = 1;
                local_4c = 1;
                goto LAB_007ac434;
              }
              bVar1 = cmExecutionStatus::GetContinueInvoked(&local_50);
              if (bVar1) {
                cmExecutionStatus::SetContinueInvoked((cmExecutionStatus *)fb.x_);
                this_local._7_1_ = 1;
                local_4c = 1;
                goto LAB_007ac434;
              }
            }
          }
LAB_007ac419:
        }
        this_local._7_1_ = 1;
        local_4c = 1;
      }
LAB_007ac434:
      ::cm::auto_ptr<cmFunctionBlocker>::~auto_ptr(&local_38);
      goto LAB_007ac466;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  this_local._7_1_ = 1;
LAB_007ac466:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmIfFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                            cmMakefile& mf,
                                            cmExecutionStatus& inStatus)
{
  // we start by recording all the functions
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "if")) {
    this->ScopeDepth++;
  } else if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endif")) {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth) {
      // Remove the function blocker for this scope or bail.
      CM_AUTO_PTR<cmFunctionBlocker> fb(mf.RemoveFunctionBlocker(this, lff));
      if (!fb.get()) {
        return false;
      }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for (unsigned int c = 0; c < this->Functions.size(); ++c) {
        // keep track of scope depth
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(), "if")) {
          scopeDepth++;
        }
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),
                                    "endif")) {
          scopeDepth--;
        }
        // watch for our state change
        if (scopeDepth == 0 &&
            !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(), "else")) {

          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
            mf.GetCMakeInstance()->IssueMessage(
              cmake::FATAL_ERROR,
              "A duplicate ELSE command was found inside an IF block.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          this->IsBlocking = this->HasRun;
          this->HasRun = true;
          this->ElseSeen = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if (!this->IsBlocking && mf.GetCMakeInstance()->GetTrace()) {
            mf.PrintCommandTrace(this->Functions[c]);
          }
        } else if (scopeDepth == 0 &&
                   !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),
                                           "elseif")) {
          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
            mf.GetCMakeInstance()->IssueMessage(
              cmake::FATAL_ERROR,
              "An ELSEIF command was found after an ELSE command.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          if (this->HasRun) {
            this->IsBlocking = true;
          } else {
            // if trace is enabled, print the evaluated "elseif" statement
            if (mf.GetCMakeInstance()->GetTrace()) {
              mf.PrintCommandTrace(this->Functions[c]);
            }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(this->Functions[c].Arguments,
                               expandedArguments);

            cmake::MessageType messType;

            cmListFileContext conditionContext =
              cmListFileContext::FromCommandContext(
                this->Functions[c], this->GetStartingContext().FilePath);

            cmConditionEvaluator conditionEvaluator(
              mf, conditionContext, mf.GetBacktrace(this->Functions[c]));

            bool isTrue = conditionEvaluator.IsTrue(expandedArguments,
                                                    errorString, messType);

            if (!errorString.empty()) {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == cmake::FATAL_ERROR) {
                cmSystemTools::SetFatalErrorOccured();
                return true;
              }
            }

            if (isTrue) {
              this->IsBlocking = false;
              this->HasRun = true;
            }
          }
        }

        // should we execute?
        else if (!this->IsBlocking) {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c], status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            inStatus.SetBreakInvoked();
            return true;
          }
          if (status.GetContinueInvoked()) {
            inStatus.SetContinueInvoked();
            return true;
          }
        }
      }
      return true;
    }
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}